

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int magma_cipher_init(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  ossl_gost_cipher_ctx *c;
  void *pvVar2;
  void *__src;
  int iVar3;
  
  c = (ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
  pvVar2 = EVP_CIPHER_CTX_get_app_data((EVP_CIPHER_CTX *)ctx);
  if (pvVar2 == (void *)0x0) {
    iVar1 = gost_cipher_set_param(c,0x3eb);
    if (iVar1 == 0) {
      return 0;
    }
    pvVar2 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    EVP_CIPHER_CTX_set_app_data((EVP_CIPHER_CTX *)ctx,pvVar2);
    if ((enc != 0) && (iVar1 = init_zero_kdf_seed(c->kdf_seed), iVar1 == 0)) {
      return -1;
    }
  }
  if (key != (uchar *)0x0) {
    magma_key(&c->cctx,key);
    magma_master_key(&c->cctx,key);
  }
  if (iv != (uchar *)0x0) {
    pvVar2 = (void *)EVP_CIPHER_CTX_original_iv(ctx);
    iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
    memcpy(pvVar2,iv,(long)iVar1);
  }
  pvVar2 = (void *)EVP_CIPHER_CTX_iv_noconst(ctx);
  __src = (void *)EVP_CIPHER_CTX_original_iv(ctx);
  iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
  memcpy(pvVar2,__src,(long)iVar1);
  iVar1 = EVP_CIPHER_CTX_get_nid(ctx);
  iVar3 = 0x400;
  if (iVar1 != 0x496) {
    iVar1 = EVP_CIPHER_CTX_get_nid(ctx);
    iVar3 = (uint)(iVar1 == 0x497) << 10;
  }
  c->key_meshing = iVar3;
  return 1;
}

Assistant:

static int magma_cipher_init(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                      const unsigned char *iv, int enc)
{
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    /* FIXME this is just initializtion check */
    if (EVP_CIPHER_CTX_get_app_data(ctx) == NULL) {
        if (!gost_cipher_set_param(c, NID_id_tc26_gost_28147_param_Z))
            return 0;
        EVP_CIPHER_CTX_set_app_data(ctx, EVP_CIPHER_CTX_get_cipher_data(ctx));

        if (enc) {
            if (init_zero_kdf_seed(c->kdf_seed) == 0)
                return -1;
        }
    }

    if (key) {
        magma_key(&(c->cctx), key);
        magma_master_key(&(c->cctx), key);
    }
    if (iv) {
        memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv,
               EVP_CIPHER_CTX_iv_length(ctx));
    }
    memcpy(EVP_CIPHER_CTX_iv_noconst(ctx),
           EVP_CIPHER_CTX_original_iv(ctx), EVP_CIPHER_CTX_iv_length(ctx));

    if (EVP_CIPHER_CTX_nid(ctx) == NID_magma_ctr_acpkm
     || EVP_CIPHER_CTX_nid(ctx) == NID_magma_ctr_acpkm_omac) {
       c->key_meshing = 1024;
    } else {
       c->key_meshing = 0;
    }

    return 1;
}